

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenTableFieldSetter(CppGenerator *this,FieldDef *field)

{
  bool bVar1;
  bool bVar2;
  Value *type_00;
  char *pcVar3;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  undefined1 local_458 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> underlying;
  anon_class_16_2_f7cfb4cb local_430;
  undefined1 local_420 [8];
  string accessor;
  string wire_type_1;
  undefined1 local_3c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> postptr;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  string local_2b0;
  string local_290;
  allocator<char> local_269;
  string local_268;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  allocator<char> local_171;
  string local_170;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  string local_98;
  undefined1 local_68 [8];
  string wire_type;
  string offset_str;
  bool is_scalar;
  Type *type;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  type_00 = &field->value;
  bVar1 = IsScalar((type_00->type).base_type);
  if ((!bVar1) || (bVar2 = IsUnion(&type_00->type), !bVar2)) {
    GenFieldOffsetName_abi_cxx11_((string *)((long)&wire_type.field_2 + 8),this,field);
    if (bVar1) {
      GenTypeWire_abi_cxx11_
                ((string *)local_68,this,&type_00->type,"",false,(bool)(field->offset64 & 1));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"SET_FN",&local_99);
      std::operator+(&local_e0,"SetField<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      std::operator+(&local_c0,&local_e0,">");
      CodeWriter::SetValue(&this->code_,&local_98,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"OFFSET_NAME",&local_101);
      CodeWriter::SetValue(&this->code_,&local_100,(string *)((long)&wire_type.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"FIELD_TYPE",&local_129);
      GenTypeBasic_abi_cxx11_(&local_150,this,&type_00->type,true);
      CodeWriter::SetValue(&this->code_,&local_128,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"FIELD_VALUE",&local_171);
      Name_abi_cxx11_(&local_1d8,this,field);
      std::operator+(&local_1b8,"_",&local_1d8);
      GenUnderlyingCast(&local_198,this,field,false,&local_1b8);
      CodeWriter::SetValue(&this->code_,&local_170,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,
                 "  bool mutate_{{FIELD_NAME}}({{FIELD_TYPE}} _{{FIELD_NAME}}\\",&local_1f9);
      CodeWriter::operator+=(&this->code_,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      bVar1 = FieldDef::IsScalarOptional(field);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,") {",&local_349);
        CodeWriter::operator+=(&this->code_,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator(&local_349);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_370,"    return {{SET_FN}}({{OFFSET_NAME}}, {{FIELD_VALUE}});",
                   &local_371);
        CodeWriter::operator+=(&this->code_,&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::allocator<char>::~allocator(&local_371);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"DEFAULT_VALUE",&local_221);
        GenDefaultConstant_abi_cxx11_(&local_248,this,field);
        CodeWriter::SetValue(&this->code_,&local_220,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator(&local_221);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"INTERFACE_DEFAULT_VALUE",&local_269);
        GenDefaultConstant_abi_cxx11_(&local_2b0,this,field);
        GenUnderlyingCast(&local_290,this,field,true,&local_2b0);
        CodeWriter::SetValue(&this->code_,&local_268,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator(&local_269);
        bVar1 = IsBool((field->value).type.base_type);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0," = {{DEFAULT_VALUE}}) {",&local_2d1);
          CodeWriter::operator+=(&this->code_,&local_2d0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::allocator<char>::~allocator(&local_2d1);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f8," = {{INTERFACE_DEFAULT_VALUE}}) {",&local_2f9);
          CodeWriter::operator+=(&this->code_,&local_2f8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::allocator<char>::~allocator(&local_2f9);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_320,
                   "    return {{SET_FN}}({{OFFSET_NAME}}, {{FIELD_VALUE}}, {{DEFAULT_VALUE}});",
                   &local_321);
        CodeWriter::operator+=(&this->code_,&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        std::allocator<char>::~allocator(&local_321);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"  }",(allocator<char> *)(postptr.field_2._M_local_buf + 0xf))
      ;
      CodeWriter::operator+=(&this->code_,&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator((allocator<char> *)(postptr.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)local_68);
    }
    else {
      NullableExtension_abi_cxx11_((string *)((long)&wire_type_1.field_2 + 8),this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                     " *",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&wire_type_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(wire_type_1.field_2._M_local_buf + 8));
      pcVar3 = (char *)std::__cxx11::string::c_str();
      GenTypeGet_abi_cxx11_
                ((string *)((long)&accessor.field_2 + 8),this,&type_00->type," ","",pcVar3,true);
      local_430.type = &type_00->type;
      local_430.field = field;
      pcVar3 = GenTableFieldSetter::anon_class_16_2_f7cfb4cb::operator()(&local_430);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_420,pcVar3,
                 (allocator<char> *)(underlying.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(underlying.field_2._M_local_buf + 0xf));
      std::operator+(&local_4b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&accessor.field_2 + 8));
      std::operator+(&local_498,&local_4b8,">(");
      std::operator+(&local_478,&local_498,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&wire_type.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                     &local_478,")");
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"FIELD_TYPE",&local_4d9);
      CodeWriter::SetValue(&this->code_,&local_4d8,(string *)((long)&accessor.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_4d8);
      std::allocator<char>::~allocator(&local_4d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_500,"FIELD_VALUE",&local_501);
      GenUnderlyingCast(&local_528,this,field,true,(string *)local_458);
      CodeWriter::SetValue(&this->code_,&local_500,&local_528);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_500);
      std::allocator<char>::~allocator(&local_501);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_548,"  {{FIELD_TYPE}}mutable_{{FIELD_NAME}}() {",&local_549);
      CodeWriter::operator+=(&this->code_,&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      std::allocator<char>::~allocator(&local_549);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_570,"    return {{FIELD_VALUE}};",&local_571);
      CodeWriter::operator+=(&this->code_,&local_570);
      std::__cxx11::string::~string((string *)&local_570);
      std::allocator<char>::~allocator(&local_571);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"  }",&local_599);
      CodeWriter::operator+=(&this->code_,&local_598);
      std::__cxx11::string::~string((string *)&local_598);
      std::allocator<char>::~allocator(&local_599);
      std::__cxx11::string::~string((string *)local_458);
      std::__cxx11::string::~string((string *)local_420);
      std::__cxx11::string::~string((string *)(accessor.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_3c0);
    }
    std::__cxx11::string::~string((string *)(wire_type.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void GenTableFieldSetter(const FieldDef &field) {
    const auto &type = field.value.type;
    const bool is_scalar = IsScalar(type.base_type);
    if (is_scalar && IsUnion(type))
      return;  // changing of a union's type is forbidden

    auto offset_str = GenFieldOffsetName(field);
    if (is_scalar) {
      const auto wire_type = GenTypeWire(type, "", false, field.offset64);
      code_.SetValue("SET_FN", "SetField<" + wire_type + ">");
      code_.SetValue("OFFSET_NAME", offset_str);
      code_.SetValue("FIELD_TYPE", GenTypeBasic(type, true));
      code_.SetValue("FIELD_VALUE",
                     GenUnderlyingCast(field, false, "_" + Name(field)));

      code_ += "  bool mutate_{{FIELD_NAME}}({{FIELD_TYPE}} _{{FIELD_NAME}}\\";
      if (!field.IsScalarOptional()) {
        code_.SetValue("DEFAULT_VALUE", GenDefaultConstant(field));
        code_.SetValue(
            "INTERFACE_DEFAULT_VALUE",
            GenUnderlyingCast(field, true, GenDefaultConstant(field)));

        // GenUnderlyingCast for a bool field generates 0 != 0
        // So the type has to be checked and the appropriate default chosen
        if (IsBool(field.value.type.base_type)) {
          code_ += " = {{DEFAULT_VALUE}}) {";
        } else {
          code_ += " = {{INTERFACE_DEFAULT_VALUE}}) {";
        }
        code_ +=
            "    return {{SET_FN}}({{OFFSET_NAME}}, {{FIELD_VALUE}}, "
            "{{DEFAULT_VALUE}});";
      } else {
        code_ += ") {";
        code_ += "    return {{SET_FN}}({{OFFSET_NAME}}, {{FIELD_VALUE}});";
      }
      code_ += "  }";
    } else {
      auto postptr = " *" + NullableExtension();
      auto wire_type = GenTypeGet(type, " ", "", postptr.c_str(), true);
      const std::string accessor = [&]() {
        if (IsStruct(type)) { return "GetStruct<"; }
        if (field.offset64) { return "GetPointer64<"; }
        return "GetPointer<";
      }();
      auto underlying = accessor + wire_type + ">(" + offset_str + ")";
      code_.SetValue("FIELD_TYPE", wire_type);
      code_.SetValue("FIELD_VALUE", GenUnderlyingCast(field, true, underlying));

      code_ += "  {{FIELD_TYPE}}mutable_{{FIELD_NAME}}() {";
      code_ += "    return {{FIELD_VALUE}};";
      code_ += "  }";
    }
  }